

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

void nn_sock_stat_increment(nn_sock *self,int name,int64_t increment)

{
  uint64_t *puVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = (int)increment;
  if (name < 0xca) {
    switch(name) {
    case 0x65:
      if (0 < increment) {
        (self->statistics).established_connections =
             (self->statistics).established_connections + increment;
        return;
      }
      goto LAB_0014fd72;
    case 0x66:
      if (0 < increment) {
        puVar1 = &(self->statistics).accepted_connections;
        *puVar1 = *puVar1 + increment;
        return;
      }
      goto LAB_0014fd77;
    case 0x67:
      if (0 < increment) {
        puVar1 = &(self->statistics).dropped_connections;
        *puVar1 = *puVar1 + increment;
        return;
      }
      break;
    case 0x68:
      if (0 < increment) {
        puVar1 = &(self->statistics).broken_connections;
        *puVar1 = *puVar1 + increment;
        return;
      }
      goto LAB_0014fd6d;
    case 0x69:
      if (0 < increment) {
        puVar1 = &(self->statistics).connect_errors;
        *puVar1 = *puVar1 + increment;
        return;
      }
      nn_sock_stat_increment_cold_14();
LAB_0014fd54:
      nn_sock_stat_increment_cold_9();
LAB_0014fd59:
      nn_sock_stat_increment_cold_8();
      break;
    case 0x6a:
      if (0 < increment) {
        puVar1 = &(self->statistics).bind_errors;
        *puVar1 = *puVar1 + increment;
        return;
      }
      goto LAB_0014fd81;
    case 0x6b:
      if (0 < increment) {
        puVar1 = &(self->statistics).accept_errors;
        *puVar1 = *puVar1 + increment;
        return;
      }
      goto LAB_0014fd86;
    default:
      if (name != 0xc9) {
        return;
      }
      if ((0 < increment) ||
         (lVar3 = (long)(self->statistics).current_connections,
         SBORROW8(lVar3,-increment) == lVar3 + increment < 0)) {
        if (0xffffffff00000002 < increment - 0x7fffffffU) {
          piVar2 = &(self->statistics).current_connections;
          *piVar2 = *piVar2 + iVar4;
          return;
        }
        goto LAB_0014fd8b;
      }
      goto LAB_0014fd9a;
    }
    nn_sock_stat_increment_cold_16();
LAB_0014fd63:
    nn_sock_stat_increment_cold_11();
LAB_0014fd68:
    nn_sock_stat_increment_cold_10();
LAB_0014fd6d:
    nn_sock_stat_increment_cold_15();
LAB_0014fd72:
    nn_sock_stat_increment_cold_18();
LAB_0014fd77:
    nn_sock_stat_increment_cold_17();
LAB_0014fd7c:
    nn_sock_stat_increment_cold_3();
LAB_0014fd81:
    nn_sock_stat_increment_cold_13();
LAB_0014fd86:
    nn_sock_stat_increment_cold_12();
LAB_0014fd8b:
    nn_sock_stat_increment_cold_7();
LAB_0014fd90:
    nn_sock_stat_increment_cold_5();
LAB_0014fd95:
    nn_sock_stat_increment_cold_2();
LAB_0014fd9a:
    nn_sock_stat_increment_cold_6();
  }
  else {
    if (300 < name) {
      switch(name) {
      case 0x12d:
        if (0 < increment) {
          puVar1 = &(self->statistics).messages_sent;
          *puVar1 = *puVar1 + increment;
          return;
        }
        goto LAB_0014fd63;
      case 0x12e:
        if (0 < increment) {
          puVar1 = &(self->statistics).messages_received;
          *puVar1 = *puVar1 + increment;
          return;
        }
        goto LAB_0014fd68;
      case 0x12f:
        if (-1 < increment) {
          puVar1 = &(self->statistics).bytes_sent;
          *puVar1 = *puVar1 + increment;
          return;
        }
        goto LAB_0014fd54;
      case 0x130:
        if (-1 < increment) {
          puVar1 = &(self->statistics).bytes_received;
          *puVar1 = *puVar1 + increment;
          return;
        }
        goto LAB_0014fd59;
      default:
        if (name != 0x191) {
          return;
        }
        if (increment == -1 || 0xffffffffffffffef < increment - 0x11U) {
          (self->statistics).current_snd_priority = iVar4;
          return;
        }
      }
      goto LAB_0014fd7c;
    }
    if (name != 0xca) {
      if (name != 0xcb) {
        return;
      }
      if ((increment < 1) &&
         (lVar3 = (long)(self->statistics).current_ep_errors,
         SBORROW8(lVar3,-increment) != lVar3 + increment < 0)) goto LAB_0014fda4;
      if (0xffffffff00000002 < increment - 0x7fffffffU) {
        piVar2 = &(self->statistics).current_ep_errors;
        *piVar2 = *piVar2 + iVar4;
        return;
      }
      goto LAB_0014fd95;
    }
    if ((0 < increment) ||
       (lVar3 = (long)(self->statistics).inprogress_connections,
       SBORROW8(lVar3,-increment) == lVar3 + increment < 0)) {
      if (0xffffffff00000002 < increment - 0x7fffffffU) {
        piVar2 = &(self->statistics).inprogress_connections;
        *piVar2 = *piVar2 + iVar4;
        return;
      }
      goto LAB_0014fd90;
    }
  }
  nn_sock_stat_increment_cold_4();
LAB_0014fda4:
  nn_sock_stat_increment_cold_1();
}

Assistant:

void nn_sock_stat_increment (struct nn_sock *self, int name, int64_t increment)
{
    switch (name) {
        case NN_STAT_ESTABLISHED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.established_connections += increment;
            break;
        case NN_STAT_ACCEPTED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.accepted_connections += increment;
            break;
        case NN_STAT_DROPPED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.dropped_connections += increment;
            break;
        case NN_STAT_BROKEN_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.broken_connections += increment;
            break;
        case NN_STAT_CONNECT_ERRORS:
            nn_assert (increment > 0);
            self->statistics.connect_errors += increment;
            break;
        case NN_STAT_BIND_ERRORS:
            nn_assert (increment > 0);
            self->statistics.bind_errors += increment;
            break;
        case NN_STAT_ACCEPT_ERRORS:
            nn_assert (increment > 0);
            self->statistics.accept_errors += increment;
            break;
        case NN_STAT_MESSAGES_SENT:
            nn_assert (increment > 0);
            self->statistics.messages_sent += increment;
            break;
        case NN_STAT_MESSAGES_RECEIVED:
            nn_assert (increment > 0);
            self->statistics.messages_received += increment;
            break;
        case NN_STAT_BYTES_SENT:
            nn_assert (increment >= 0);
            self->statistics.bytes_sent += increment;
            break;
        case NN_STAT_BYTES_RECEIVED:
            nn_assert (increment >= 0);
            self->statistics.bytes_received += increment;
            break;

        case NN_STAT_CURRENT_CONNECTIONS:
            nn_assert (increment > 0 ||
                self->statistics.current_connections >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.current_connections += (int) increment;
            break;
        case NN_STAT_INPROGRESS_CONNECTIONS:
            nn_assert (increment > 0 ||
                self->statistics.inprogress_connections >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.inprogress_connections += (int) increment;
            break;
        case NN_STAT_CURRENT_SND_PRIORITY:
            /*  This is an exception, we don't want to increment priority  */
            nn_assert((increment > 0 && increment <= 16) || increment == -1);
            self->statistics.current_snd_priority = (int) increment;
            break;
        case NN_STAT_CURRENT_EP_ERRORS:
            nn_assert (increment > 0 ||
                self->statistics.current_ep_errors >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.current_ep_errors += (int) increment;
            break;
    }
}